

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_localtime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  tm *ptVar2;
  jx9_value *pVal;
  jx9_value *pArray_00;
  tm *pTm_1;
  time_t t_1;
  time_t t;
  tm *pTm;
  Sytm sTm;
  int isAssoc;
  jx9_value *pArray;
  jx9_value *pValue;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sTm.tm_gmtoff._4_4_ = 0;
  if (nArg < 1) {
    time(&t_1);
    t = (time_t)localtime(&t_1);
    sTm.tm_sec = ((tm *)t)->tm_hour;
    pTm._4_4_ = ((tm *)t)->tm_min;
    pTm._0_4_ = ((tm *)t)->tm_sec;
    sTm.tm_hour = ((tm *)t)->tm_mon;
    sTm.tm_min = ((tm *)t)->tm_mday;
    iVar1 = ((tm *)t)->tm_year;
    sTm.tm_year = ((tm *)t)->tm_yday;
    sTm.tm_mon = ((tm *)t)->tm_wday;
    sTm.tm_wday = ((tm *)t)->tm_isdst;
  }
  else {
    iVar1 = jx9_value_is_int(*apArg);
    if (iVar1 == 0) {
      time((time_t *)&pTm_1);
    }
    else {
      pTm_1 = (tm *)jx9_value_to_int64(*apArg);
      ptVar2 = localtime((time_t *)&pTm_1);
      if (ptVar2 == (tm *)0x0) {
        time((time_t *)&pTm_1);
      }
    }
    ptVar2 = localtime((time_t *)&pTm_1);
    sTm.tm_sec = ptVar2->tm_hour;
    pTm._4_4_ = ptVar2->tm_min;
    pTm._0_4_ = ptVar2->tm_sec;
    sTm.tm_hour = ptVar2->tm_mon;
    sTm.tm_min = ptVar2->tm_mday;
    iVar1 = ptVar2->tm_year;
    sTm.tm_year = ptVar2->tm_yday;
    sTm.tm_mon = ptVar2->tm_wday;
    sTm.tm_wday = ptVar2->tm_isdst;
  }
  sTm.tm_mday = iVar1 + 0x76c;
  sTm.tm_zone = (char *)0x0;
  sTm.tm_isdst = 0;
  sTm._36_4_ = 0;
  pVal = jx9_context_new_scalar(pCtx);
  if (pVal == (jx9_value *)0x0) {
    jx9_result_null(pCtx);
  }
  else {
    pArray_00 = jx9_context_new_array(pCtx);
    if (pArray_00 == (jx9_value *)0x0) {
      jx9_result_null(pCtx);
    }
    else {
      if (1 < nArg) {
        sTm.tm_gmtoff._4_4_ = jx9_value_to_bool(apArg[1]);
      }
      jx9_value_int(pVal,(int)pTm);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_sec",pVal);
      }
      jx9_value_int(pVal,pTm._4_4_);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_min",pVal);
      }
      jx9_value_int(pVal,sTm.tm_sec);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_hour",pVal);
      }
      jx9_value_int(pVal,sTm.tm_min);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_mday",pVal);
      }
      jx9_value_int(pVal,sTm.tm_hour);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_mon",pVal);
      }
      jx9_value_int(pVal,sTm.tm_mday + -0x76c);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_year",pVal);
      }
      jx9_value_int(pVal,sTm.tm_mon);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_wday",pVal);
      }
      jx9_value_int(pVal,sTm.tm_year);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_yday",pVal);
      }
      jx9_value_int(pVal,sTm.tm_wday);
      if (sTm.tm_gmtoff._4_4_ == 0) {
        jx9_array_add_elem(pArray_00,(jx9_value *)0x0,pVal);
      }
      else {
        jx9_array_add_strkey_elem(pArray_00,"tm_isdst",pVal);
      }
      jx9_result_value(pCtx,pArray_00);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_localtime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pArray;
	int isAssoc = 0;
	Sytm sTm;
	if( nArg < 1 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS); /* TODO(chems): GMT not local */
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[0]) ){
			t = (time_t)jx9_value_to_int64(apArg[0]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg > 1 ){
		isAssoc = jx9_value_to_bool(apArg[1]); 
	}
	/* Fill the array */
	/* Seconds */
	jx9_value_int(pValue, sTm.tm_sec);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_sec", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Minutes */
	jx9_value_int(pValue, sTm.tm_min);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_min", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Hours */
	jx9_value_int(pValue, sTm.tm_hour);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_hour", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* mday */
	jx9_value_int(pValue, sTm.tm_mday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_mday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* mon */
	jx9_value_int(pValue, sTm.tm_mon);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_mon", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* year since 1900 */
	jx9_value_int(pValue, sTm.tm_year-1900);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_year", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* wday */
	jx9_value_int(pValue, sTm.tm_wday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_wday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* yday */
	jx9_value_int(pValue, sTm.tm_yday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_yday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* isdst */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
	jx9_value_int(pValue, sTm.tm_isdst);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_isdst", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Return the array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}